

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__index_of_refraction
          (ColladaParserAutoGen14Private *this)

{
  ColladaParserAutoGen14Private *this_local;
  
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__index_of_refraction()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__index_of_refraction();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}